

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool execCommand(QString *program,QStringList *args,QByteArray *output,bool verbose)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  byte in_CL;
  QByteArray *in_RDX;
  QFlags *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  int FinishTimeout;
  QByteArray stdOut;
  QProcess process;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString> command;
  undefined4 in_stack_fffffffffffffe08;
  OpenModeFlag in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  QStringBuilder<const_QString_&,_QLatin1String> *in_stack_fffffffffffffe18;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  QString *in_stack_fffffffffffffe28;
  bool local_169;
  QString local_150 [2];
  char local_120 [32];
  QString local_100 [2];
  char local_d0 [40];
  QString local_a8;
  QChar local_7a [13];
  QLatin1StringView local_60;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0,0x30);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  local_60 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe18,
                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  operator+((QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
            (QLatin1String *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  QChar::QChar<char16_t,_true>(local_7a,L' ');
  QListSpecialMethods<QString>::join
            ((QListSpecialMethods<QString> *)in_stack_fffffffffffffe18,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffffe28 >> 0x30));
  operator+(in_stack_fffffffffffffe18,
            (QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  QString::~QString((QString *)0x10dc6a);
  pFVar5 = _stdout;
  if (((in_CL & 1) != 0) && ((g_options.verbose & 1U) != 0)) {
    QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
    ::toUtf8((QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
              *)in_stack_fffffffffffffe18);
    pcVar2 = QByteArray::constData((QByteArray *)0x10dcab);
    fprintf(pFVar5,"Execute %s.\n",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x10dcce);
  }
  local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_a8,(QObject *)0x0);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe0c
            );
  QProcess::start(&local_a8,(QList_conflict1 *)in_RDI,in_RSI);
  uVar3 = QProcess::waitForStarted((int)&local_a8);
  if ((uVar3 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QtPrivate::asString(local_100);
    QString::toLocal8Bit(in_stack_fffffffffffffe28);
    pcVar2 = QByteArray::constData((QByteArray *)0x10ddb3);
    QMessageLogger::critical(local_d0,"Cannot execute command %s.",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x10ddd9);
    QString::~QString((QString *)0x10dde6);
    local_169 = false;
  }
  else {
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    uVar3 = QString::endsWith((QLatin1String *)in_RDI,(CaseSensitivity)QVar4.m_size);
    if ((uVar3 & 1) == 0) {
      iVar1 = g_options.timeoutSecs * 1000;
    }
    else {
      iVar1 = 30000;
    }
    uVar3 = QProcess::waitForFinished((int)&local_a8);
    if ((uVar3 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar1,in_stack_fffffffffffffe20),
                 (char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                 (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QtPrivate::asString(local_150);
      QString::toLocal8Bit(in_RDI);
      pcVar2 = QByteArray::constData((QByteArray *)0x10ded1);
      QMessageLogger::critical(local_120,"Execution of command %s timed out.",pcVar2);
      QByteArray::~QByteArray((QByteArray *)0x10def7);
      QString::~QString((QString *)0x10df04);
      local_169 = false;
    }
    else {
      QProcess::readAllStandardOutput();
      if (in_RDX != (QByteArray *)0x0) {
        QByteArray::append(in_RDX);
      }
      if (((in_CL & 1) != 0) && ((g_options.verbose & 1U) != 0)) {
        pFVar5 = _stdout;
        pcVar2 = QByteArray::constData((QByteArray *)0x10dfa1);
        fprintf(pFVar5,"%s\n",pcVar2);
      }
      iVar1 = QProcess::exitCode();
      local_169 = iVar1 == 0;
      QByteArray::~QByteArray((QByteArray *)0x10dfe8);
    }
  }
  QProcess::~QProcess((QProcess *)&local_a8);
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString> *)0x10e002);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_169;
  }
  __stack_chk_fail();
}

Assistant:

static bool execCommand(const QString &program, const QStringList &args,
                        QByteArray *output = nullptr, bool verbose = false)
{
    const auto command = program + " "_L1 + args.join(u' ');

    if (verbose && g_options.verbose)
        fprintf(stdout,"Execute %s.\n", command.toUtf8().constData());

    QProcess process;
    process.start(program, args);
    if (!process.waitForStarted()) {
        qCritical("Cannot execute command %s.", qPrintable(command));
        return false;
    }

    // If the command is not adb, for example, make or ninja, it can take more that
    // QProcess::waitForFinished() 30 secs, so for that use a higher timeout.
    const int FinishTimeout = program.endsWith("adb"_L1) ? 30000 : g_options.timeoutSecs * 1000;
    if (!process.waitForFinished(FinishTimeout)) {
        qCritical("Execution of command %s timed out.", qPrintable(command));
        return false;
    }

    const auto stdOut = process.readAllStandardOutput();
    if (output)
        output->append(stdOut);

    if (verbose && g_options.verbose)
        fprintf(stdout, "%s\n", stdOut.constData());

    return process.exitCode() == 0;
}